

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::UpdateClipRect(ImDrawList *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  float fVar11;
  int iVar12;
  ImVec4 *pIVar13;
  ImDrawCmd *pIVar14;
  long lVar15;
  int iVar16;
  ImDrawCmd *pIVar17;
  long lVar18;
  ImTextureID pvVar19;
  int iVar20;
  void *pvVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ImVec4 curr_clip_rect;
  
  lVar15 = (long)(this->_ClipRectStack).Size;
  pIVar13 = &GNullClipRect;
  if (lVar15 != 0) {
    pIVar13 = (this->_ClipRectStack).Data + lVar15 + -1;
  }
  uVar7 = pIVar13->x;
  uVar8 = pIVar13->y;
  uVar9 = pIVar13->z;
  uVar10 = pIVar13->w;
  uVar5 = (this->CmdBuffer).Size;
  lVar15 = (long)(int)uVar5;
  pIVar14 = (this->CmdBuffer).Data;
  if ((pIVar14 + lVar15 + -1 == (ImDrawCmd *)0x0 || lVar15 < 1) ||
     (((uVar6 = pIVar14[lVar15 + -1].ElemCount, curr_clip_rect.x._0_1_ = (char)uVar7,
       curr_clip_rect.x._1_1_ = (char)((uint)uVar7 >> 8),
       curr_clip_rect.x._2_1_ = (char)((uint)uVar7 >> 0x10),
       curr_clip_rect.x._3_1_ = (char)((uint)uVar7 >> 0x18), curr_clip_rect.y._0_1_ = (char)uVar8,
       curr_clip_rect.y._1_1_ = (char)((uint)uVar8 >> 8),
       curr_clip_rect.y._2_1_ = (char)((uint)uVar8 >> 0x10),
       curr_clip_rect.y._3_1_ = (char)((uint)uVar8 >> 0x18), curr_clip_rect.z._0_1_ = (char)uVar9,
       curr_clip_rect.z._1_1_ = (char)((uint)uVar9 >> 8),
       curr_clip_rect.z._2_1_ = (char)((uint)uVar9 >> 0x10),
       curr_clip_rect.z._3_1_ = (char)((uint)uVar9 >> 0x18), curr_clip_rect.w._0_1_ = (char)uVar10,
       curr_clip_rect.w._1_1_ = (char)((uint)uVar10 >> 8),
       curr_clip_rect.w._2_1_ = (char)((uint)uVar10 >> 0x10),
       curr_clip_rect.w._3_1_ = (char)((uint)uVar10 >> 0x18), uVar6 != 0 &&
       (auVar22[0] = -(*(char *)&pIVar14[lVar15 + -1].ClipRect.x == curr_clip_rect.x._0_1_),
       auVar22[1] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.x + 1) ==
                     curr_clip_rect.x._1_1_),
       auVar22[2] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.x + 2) ==
                     curr_clip_rect.x._2_1_),
       auVar22[3] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.x + 3) ==
                     curr_clip_rect.x._3_1_),
       auVar22[4] = -(*(char *)&pIVar14[lVar15 + -1].ClipRect.y == curr_clip_rect.y._0_1_),
       auVar22[5] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.y + 1) ==
                     curr_clip_rect.y._1_1_),
       auVar22[6] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.y + 2) ==
                     curr_clip_rect.y._2_1_),
       auVar22[7] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.y + 3) ==
                     curr_clip_rect.y._3_1_),
       auVar22[8] = -(*(char *)&pIVar14[lVar15 + -1].ClipRect.z == curr_clip_rect.z._0_1_),
       auVar22[9] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.z + 1) ==
                     curr_clip_rect.z._1_1_),
       auVar22[10] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.z + 2) ==
                      curr_clip_rect.z._2_1_),
       auVar22[0xb] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.z + 3) ==
                       curr_clip_rect.z._3_1_),
       auVar22[0xc] = -(*(char *)&pIVar14[lVar15 + -1].ClipRect.w == curr_clip_rect.w._0_1_),
       auVar22[0xd] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.w + 1) ==
                       curr_clip_rect.w._1_1_),
       auVar22[0xe] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.w + 2) ==
                       curr_clip_rect.w._2_1_),
       auVar22[0xf] = -(*(char *)((long)&pIVar14[lVar15 + -1].ClipRect.w + 3) ==
                       curr_clip_rect.w._3_1_),
       (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf)
       != 0xffff)) || (pIVar14[lVar15 + -1].UserCallback != (ImDrawCallback)0x0)))) {
    lVar15 = (long)(this->_ClipRectStack).Size;
    pIVar13 = &GNullClipRect;
    if (lVar15 != 0) {
      pIVar13 = (this->_ClipRectStack).Data + lVar15 + -1;
    }
    fVar4 = pIVar13->x;
    uVar2 = pIVar13->y;
    uVar3 = pIVar13->z;
    lVar15 = (long)(this->_TextureIdStack).Size;
    if (lVar15 == 0) {
      pvVar21 = (void *)0x0;
    }
    else {
      pvVar21 = (this->_TextureIdStack).Data[lVar15 + -1];
    }
    if ((fVar4 <= (float)uVar3) && (fVar1 = pIVar13->w, (float)uVar2 <= fVar1)) {
      iVar12 = (this->CmdBuffer).Size;
      if (iVar12 == (this->CmdBuffer).Capacity) {
        if (iVar12 == 0) {
          iVar16 = 8;
        }
        else {
          iVar16 = iVar12 / 2 + iVar12;
        }
        iVar20 = iVar12 + 1;
        if (iVar12 + 1 < iVar16) {
          iVar20 = iVar16;
        }
        pIVar14 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar20 * 0x30);
        pIVar17 = (this->CmdBuffer).Data;
        if (pIVar17 == (ImDrawCmd *)0x0) {
          pIVar17 = (ImDrawCmd *)0x0;
        }
        else {
          memcpy(pIVar14,pIVar17,(long)(this->CmdBuffer).Size * 0x30);
          pIVar17 = (this->CmdBuffer).Data;
        }
        ImGui::MemFree(pIVar17);
        (this->CmdBuffer).Data = pIVar14;
        (this->CmdBuffer).Capacity = iVar20;
        iVar12 = (this->CmdBuffer).Size;
      }
      else {
        pIVar14 = (this->CmdBuffer).Data;
      }
      (this->CmdBuffer).Size = iVar12 + 1;
      pIVar14[iVar12].ElemCount = 0;
      pIVar14[iVar12].ClipRect.x = fVar4;
      pIVar14[iVar12].ClipRect.y = (float)uVar2;
      pIVar14[iVar12].ClipRect.z = (float)uVar3;
      pIVar14[iVar12].ClipRect.w = fVar1;
      pIVar14[iVar12].TextureId = pvVar21;
      pIVar14[iVar12].UserCallback = (ImDrawCallback)0x0;
      (&pIVar14[iVar12].UserCallback)[1] = (ImDrawCallback)0x0;
      return;
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                  ,0xab,"void ImDrawList::AddDrawCmd()");
  }
  if (((1 < uVar5) && (uVar6 == 0)) &&
     (auVar23[0] = -(*(char *)&pIVar14[lVar15 + -2].ClipRect.x == curr_clip_rect.x._0_1_),
     auVar23[1] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.x + 1) == curr_clip_rect.x._1_1_)
     , auVar23[2] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.x + 2) ==
                     curr_clip_rect.x._2_1_),
     auVar23[3] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.x + 3) == curr_clip_rect.x._3_1_)
     , auVar23[4] = -(*(char *)&pIVar14[lVar15 + -2].ClipRect.y == curr_clip_rect.y._0_1_),
     auVar23[5] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.y + 1) == curr_clip_rect.y._1_1_)
     , auVar23[6] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.y + 2) ==
                     curr_clip_rect.y._2_1_),
     auVar23[7] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.y + 3) == curr_clip_rect.y._3_1_)
     , auVar23[8] = -(*(char *)&pIVar14[lVar15 + -2].ClipRect.z == curr_clip_rect.z._0_1_),
     auVar23[9] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.z + 1) == curr_clip_rect.z._1_1_)
     , auVar23[10] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.z + 2) ==
                      curr_clip_rect.z._2_1_),
     auVar23[0xb] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.z + 3) ==
                     curr_clip_rect.z._3_1_),
     auVar23[0xc] = -(*(char *)&pIVar14[lVar15 + -2].ClipRect.w == curr_clip_rect.w._0_1_),
     auVar23[0xd] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.w + 1) ==
                     curr_clip_rect.w._1_1_),
     auVar23[0xe] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.w + 2) ==
                     curr_clip_rect.w._2_1_),
     auVar23[0xf] = -(*(char *)((long)&pIVar14[lVar15 + -2].ClipRect.w + 3) ==
                     curr_clip_rect.w._3_1_),
     (ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe | (ushort)(auVar23[0xf] >> 7) << 0xf)
     == 0xffff)) {
    lVar18 = (long)(this->_TextureIdStack).Size;
    if (lVar18 == 0) {
      pvVar19 = (ImTextureID)0x0;
    }
    else {
      pvVar19 = (this->_TextureIdStack).Data[lVar18 + -1];
    }
    if ((pIVar14[lVar15 + -2].TextureId == pvVar19) &&
       (pIVar14[lVar15 + -2].UserCallback == (ImDrawCallback)0x0)) {
      (this->CmdBuffer).Size = uVar5 - 1;
      return;
    }
  }
  fVar4 = pIVar13->y;
  fVar1 = pIVar13->z;
  fVar11 = pIVar13->w;
  pIVar14[lVar15 + -1].ClipRect.x = pIVar13->x;
  pIVar14[lVar15 + -1].ClipRect.y = fVar4;
  pIVar14[lVar15 + -1].ClipRect.z = fVar1;
  pIVar14[lVar15 + -1].ClipRect.w = fVar11;
  return;
}

Assistant:

void ImDrawList::UpdateClipRect()
{
    // If current command is used with different settings we need to add a new command
    const ImVec4 curr_clip_rect = GetCurrentClipRect();
    ImDrawCmd* curr_cmd = CmdBuffer.Size > 0 ? &CmdBuffer.Data[CmdBuffer.Size-1] : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) != 0) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && memcmp(&prev_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) == 0 && prev_cmd->TextureId == GetCurrentTextureId() && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->ClipRect = curr_clip_rect;
}